

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall
backward::Printer::print_trace(Printer *this,ostream *os,ResolvedTrace *trace,Colorize *colorize)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  SourceLoc *source_loc;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
  lVar3 = *(long *)os;
  lVar4 = *(long *)(lVar3 + -0x18);
  *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  if (((trace->source).filename._M_string_length == 0) || (bVar1 = true, this->object == true)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"   Object \"",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(trace->object_filename)._M_dataplus._M_p,
                        (trace->object_filename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", at ",6);
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", in ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(trace->object_function)._M_dataplus._M_p,
                        (trace->object_function)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    bVar1 = false;
  }
  lVar3 = (long)(trace->inliners).
                super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(trace->inliners).
                super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    if ((trace->source).filename._M_string_length == 0) {
      return;
    }
    if (bVar1) goto LAB_00109345;
  }
  else {
    lVar4 = (lVar3 >> 3) * -0x71c71c71c71c71c7;
    do {
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"   ",3);
      }
      source_loc = (SourceLoc *)
                   ((long)&(trace->inliners).
                           super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].function._M_dataplus._M_p +
                   lVar3);
      print_source_loc(this,os," | ",source_loc,(void *)0x0);
      if (this->snippet == true) {
        print_snippet(this,os,"    | ",source_loc,colorize,purple,this->inliner_context_size);
      }
      lVar4 = lVar4 + -1;
      bVar1 = false;
      lVar3 = lVar3 + -0x48;
    } while (lVar4 != 0);
    if ((trace->source).filename._M_string_length == 0) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"   ",3);
LAB_00109345:
  print_source_loc(this,os,"   ",&trace->source,(trace->super_Trace).addr);
  if (this->snippet == true) {
    print_snippet(this,os,"      ",&trace->source,colorize,yellow,this->trace_context_size);
  }
  return;
}

Assistant:

void print_trace(std::ostream &os, const ResolvedTrace &trace,
                   Colorize &colorize) {
    os << "#" << std::left << std::setw(2) << trace.idx << std::right;
    bool already_indented = true;

    if (!trace.source.filename.size() || object) {
      os << "   Object \"" << trace.object_filename << "\", at " << trace.addr
         << ", in " << trace.object_function << "\n";
      already_indented = false;
    }

    for (size_t inliner_idx = trace.inliners.size(); inliner_idx > 0;
         --inliner_idx) {
      if (!already_indented) {
        os << "   ";
      }
      const ResolvedTrace::SourceLoc &inliner_loc =
          trace.inliners[inliner_idx - 1];
      print_source_loc(os, " | ", inliner_loc);
      if (snippet) {
        print_snippet(os, "    | ", inliner_loc, colorize, Color::purple,
                      inliner_context_size);
      }
      already_indented = false;
    }

    if (trace.source.filename.size()) {
      if (!already_indented) {
        os << "   ";
      }
      print_source_loc(os, "   ", trace.source, trace.addr);
      if (snippet) {
        print_snippet(os, "      ", trace.source, colorize, Color::yellow,
                      trace_context_size);
      }
    }
  }